

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_randomizer(void)

{
  int iVar1;
  long lVar2;
  
  wr_u32b(Rand_value);
  wr_u32b(state_i);
  wr_u32b(z0);
  wr_u32b(z1);
  wr_u32b(z2);
  lVar2 = 0;
  do {
    wr_u32b(STATE[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  iVar1 = 0x1b;
  do {
    wr_u32b(0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void wr_randomizer(void)
{
	int i;

	/* current value for the simple RNG */
	wr_u32b(Rand_value);

	/* state index */
	wr_u32b(state_i);

	/* RNG variables */
	wr_u32b(z0);
	wr_u32b(z1);
	wr_u32b(z2);

	/* RNG state */
	for (i = 0; i < RAND_DEG; i++)
		wr_u32b(STATE[i]);

	/* NULL padding */
	for (i = 0; i < 59 - RAND_DEG; i++)
		wr_u32b(0);
}